

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trend_suite.cpp
# Opt level: O0

void double_suite::test_linear_decrease(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  double absolute_tolerance;
  double *in_stack_fffffffffffffe88;
  double local_168;
  value_type local_160;
  size_type local_158;
  double local_148;
  value_type local_140;
  size_type local_138;
  double local_128;
  value_type local_120;
  size_type local_118;
  double local_108;
  value_type local_100;
  size_type local_f8;
  double local_e8;
  value_type local_e0;
  size_type local_d8;
  double local_c8;
  value_type local_c0;
  size_type local_b8;
  double local_a8;
  value_type local_a0;
  size_type local_98;
  double local_88;
  value_type local_80;
  size_type local_78;
  double local_68;
  value_type local_60;
  size_type local_58;
  double local_48;
  value_type local_40;
  undefined1 local_38 [8];
  trend<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.grand.member.count,1e-05,absolute_tolerance);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::basic_trend
            ((basic_trend<double,_(trial::online::with)1> *)local_38);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,10.0);
  local_40 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_48 = 10.0;
  local_58 = filter.grand.member.count;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","10.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x61,0x106373,(char *)&local_40,&local_48,in_stack_fffffffffffffe88,
             predicate_08);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,9.0);
  local_60 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_68 = 9.0;
  local_78 = filter.grand.member.count;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","9.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x63,0x106373,(char *)&local_60,&local_68,in_stack_fffffffffffffe88,
             predicate_07);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,8.0);
  local_80 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_88 = 8.0;
  local_98 = filter.grand.member.count;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","8.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x65,0x106373,(char *)&local_80,&local_88,in_stack_fffffffffffffe88,
             predicate_06);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,7.0);
  local_a0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_a8 = 7.0;
  local_b8 = filter.grand.member.count;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","7.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x67,0x106373,(char *)&local_a0,&local_a8,in_stack_fffffffffffffe88,
             predicate_05);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,6.0);
  local_c0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_c8 = 6.0;
  local_d8 = filter.grand.member.count;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","6.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x69,0x106373,(char *)&local_c0,&local_c8,in_stack_fffffffffffffe88,
             predicate_04);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,5.0);
  local_e0 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                       ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_e8 = 5.0;
  local_f8 = filter.grand.member.count;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","5.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x6b,0x106373,(char *)&local_e0,&local_e8,in_stack_fffffffffffffe88,
             predicate_03);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,4.0);
  local_100 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_108 = 4.0;
  local_118 = filter.grand.member.count;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","4.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x6d,0x106373,(char *)&local_100,&local_108,in_stack_fffffffffffffe88,
             predicate_02);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,3.0);
  local_120 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_128 = 3.0;
  local_138 = filter.grand.member.count;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x6f,0x106373,(char *)&local_120,&local_128,in_stack_fffffffffffffe88,
             predicate_01);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,2.0);
  local_140 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_148 = 2.0;
  local_158 = filter.grand.member.count;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x71,0x106373,(char *)&local_140,&local_148,in_stack_fffffffffffffe88,
             predicate_00);
  trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::push
            ((basic_trend<double,_(trial::online::with)1> *)local_38,1.0);
  local_160 = trial::online::cumulative::basic_trend<double,_(trial::online::with)1>::value
                        ((basic_trend<double,_(trial::online::with)1> *)local_38);
  local_168 = 1.0;
  predicate.absolute = tolerance.relative;
  predicate.relative = (double)filter.grand.member.count;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x73,0x106373,(char *)&local_160,&local_168,
             (double *)filter.grand.member.count,predicate);
  return;
}

Assistant:

void test_linear_decrease()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::trend<double> filter;

    filter.push(10.0);
    TRIAL_TEST_WITH(filter.value(), 10.0, tolerance);
    filter.push(9.0);
    TRIAL_TEST_WITH(filter.value(), 9.0, tolerance);
    filter.push(8.0);
    TRIAL_TEST_WITH(filter.value(), 8.0, tolerance);
    filter.push(7.0);
    TRIAL_TEST_WITH(filter.value(), 7.0, tolerance);
    filter.push(6.0);
    TRIAL_TEST_WITH(filter.value(), 6.0, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.value(), 5.0, tolerance);
    filter.push(4.0);
    TRIAL_TEST_WITH(filter.value(), 4.0, tolerance);
    filter.push(3.0);
    TRIAL_TEST_WITH(filter.value(), 3.0, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 2.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
}